

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool GUINewFrame(HGUI handle,vector<GUIComponent,_std::allocator<GUIComponent>_> *gui_components,
                vector<GUITexture,_std::allocator<GUITexture>_> *textures)

{
  int iVar1;
  mu_Context *pmVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  mu_Color mVar8;
  uint32_t uVar9;
  ulong uVar10;
  char *pcVar11;
  reference pGVar12;
  float fVar13;
  float fVar14;
  mu_Rect mVar15;
  uchar local_154;
  mu_Color local_114;
  uint local_110;
  mu_Color color;
  int i_1;
  int i;
  int widths_3 [5];
  int local_e8;
  int local_e4;
  int widths_2 [4];
  int widths_1 [3];
  int widths [2];
  int column_widths [2];
  GUIComponent *component_1;
  iterator __end3;
  iterator __begin3;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range3;
  int component_5_w;
  int component_4_w;
  int component_3_w;
  int component_2_w;
  int component_1_w;
  int column_2_w;
  int column_1_w;
  int label_text_w;
  mu_Container *panel;
  int local_60;
  int local_5c;
  int empty_width [1];
  int window_w;
  GUI *gui;
  GUIComponent *component;
  iterator __end1;
  iterator __begin1;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range1;
  uint32_t components_in_use;
  vector<GUITexture,_std::allocator<GUITexture>_> *textures_local;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *gui_components_local;
  HGUI handle_local;
  
  bVar3 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::empty(gui_components);
  if ((bVar3) &&
     (bVar3 = std::vector<GUITexture,_std::allocator<GUITexture>_>::empty(textures), bVar3)) {
    handle_local._7_1_ = false;
  }
  else {
    __range1._4_4_ = 0;
    __end1 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin(gui_components);
    component = (GUIComponent *)
                std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end(gui_components);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                       *)&component), bVar3) {
      pGVar12 = __gnu_cxx::
                __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                ::operator*(&__end1);
      if ((pGVar12->IsInUse & 1U) != 0) {
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>::
      operator++(&__end1);
    }
    if ((__range1._4_4_ == 0) &&
       (bVar3 = std::vector<GUITexture,_std::allocator<GUITexture>_>::empty(textures), bVar3)) {
      handle_local._7_1_ = false;
    }
    else {
      local_5c = 300;
      local_60 = -1;
      _empty_width = handle;
      mu_begin(*(mu_Context **)((long)handle + 0x10));
      pmVar2 = *(mu_Context **)((long)_empty_width + 0x10);
      mVar15 = mu_rect(0,0,local_5c,*(int *)((long)_empty_width + 0x1a0c9c));
      iVar4 = mu_begin_window_ex(pmVar2,"",mVar15,0x2080);
      if (iVar4 != 0) {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),1,&local_60,-1);
          mu_begin_panel_ex(*(mu_Context **)((long)_empty_width + 0x10),"Log Output",0);
          mu_get_current_container(*(mu_Context **)((long)_empty_width + 0x10));
          mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),1,&local_60,-1);
          pmVar2 = *(mu_Context **)((long)_empty_width + 0x10);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          mu_text(pmVar2,pcVar11);
          mu_end_panel(*(mu_Context **)((long)_empty_width + 0x10));
        }
        else {
          fVar13 = (float)local_5c;
          fVar14 = (float)local_5c;
          iVar5 = local_5c + -0x96;
          iVar4 = *(int *)(*(long *)(*(long *)((long)_empty_width + 0x10) + 0x78) + 0x10);
          iVar1 = *(int *)(*(long *)(*(long *)((long)_empty_width + 0x10) + 0x78) + 0x10);
          iVar6 = (int)(-(float)*(int *)(*(long *)(*(long *)((long)_empty_width + 0x10) + 0x78) +
                                        0x10) * 0.5 + (float)iVar5 / 4.0);
          iVar7 = (int)(-(float)*(int *)(*(long *)(*(long *)((long)_empty_width + 0x10) + 0x78) +
                                        0x10) * 0.5 + (float)iVar5 / 5.0);
          __end3 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin(gui_components);
          component_1 = (GUIComponent *)
                        std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end
                                  (gui_components);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                             *)&component_1), bVar3) {
            pGVar12 = __gnu_cxx::
                      __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                      ::operator*(&__end3);
            if ((pGVar12->IsInUse & 1U) != 0) {
              widths[0] = (int)(fVar13 * 0.5);
              widths[1] = (int)(fVar14 * 0.5) + -0xf;
              mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),2,widths,0);
              mu_layout_begin_column(*(mu_Context **)((long)_empty_width + 0x10));
              switch(pGVar12->Type) {
              case EGUIComponentTypeSlider1:
                mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),1,&local_60,0);
                break;
              case EGUIComponentTypeSlider2:
                widths_1[2] = -1;
                widths_1[1] = (int)(-(float)iVar4 * 0.5 + (float)iVar5 / 2.0);
                mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),2,widths_1 + 1,0);
                break;
              case EGUIComponentTypeSlider3:
                widths_1[0] = -1;
                widths_2[3] = (int)(-(float)iVar1 * 0.5 + (float)iVar5 / 3.0);
                mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),3,widths_2 + 3,0);
                break;
              case EGUIComponentTypeSlider4:
              case EGUIComponentTypeColor3:
                widths_2[1] = -1;
                local_e8 = iVar6;
                local_e4 = iVar6;
                widths_2[0] = iVar6;
                mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),4,&local_e8,0);
                break;
              case EGUIComponentTypeColor4:
                widths_3[2] = -1;
                i_1 = iVar7;
                i = iVar7;
                widths_3[0] = iVar7;
                widths_3[1] = iVar7;
                mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),5,&i_1,0);
              }
              bVar3 = GUIIsSliderType(pGVar12->Type);
              if (bVar3) {
                color.r = '\0';
                color.g = '\0';
                color.b = '\0';
                color.a = '\0';
                for (; mVar8 = (mu_Color)GUIComponents(pGVar12->Type), (uint)color < (uint)mVar8;
                    color = (mu_Color)((int)color + 1)) {
                  mu_slider_ex(*(mu_Context **)((long)_empty_width + 0x10),
                               pGVar12->Data + (int)color,(pGVar12->field_4).SliderRange.Start,
                               (pGVar12->field_4).SliderRange.End,0.01,"%.2f",1);
                }
              }
              else {
                for (local_110 = 0; uVar9 = GUIComponents(pGVar12->Type), local_110 < uVar9;
                    local_110 = local_110 + 1) {
                  pGVar12->Data[(int)local_110] = pGVar12->Data[(int)local_110] * 255.0;
                  mu_slider_ex(*(mu_Context **)((long)_empty_width + 0x10),
                               pGVar12->Data + (int)local_110,0.0,255.0,0.0,"%.0f",1);
                  pGVar12->Data[(int)local_110] = pGVar12->Data[(int)local_110] / 255.0;
                }
                local_114.g = (char)(int)(pGVar12->Data[1] * 255.0);
                local_114.r = (char)(int)(pGVar12->Data[0] * 255.0);
                local_114.b = (char)(int)(pGVar12->Data[2] * 255.0);
                uVar9 = GUIComponents(pGVar12->Type);
                if (uVar9 == 4) {
                  local_154 = (uchar)(int)(pGVar12->Data[3] * 255.0);
                }
                else {
                  local_154 = 0xff;
                }
                local_114.a = local_154;
                pmVar2 = *(mu_Context **)((long)_empty_width + 0x10);
                mVar15 = mu_layout_next(*(mu_Context **)((long)_empty_width + 0x10));
                mu_draw_rect(pmVar2,mVar15,local_114);
              }
              mu_layout_end_column(*(mu_Context **)((long)_empty_width + 0x10));
              mu_layout_begin_column(*(mu_Context **)((long)_empty_width + 0x10));
              mu_layout_row(*(mu_Context **)((long)_empty_width + 0x10),1,&local_60,0);
              pmVar2 = *(mu_Context **)((long)_empty_width + 0x10);
              pcVar11 = (char *)std::__cxx11::string::c_str();
              mu_label(pmVar2,pcVar11);
              mu_layout_end_column(*(mu_Context **)((long)_empty_width + 0x10));
            }
            __gnu_cxx::
            __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
            ::operator++(&__end3);
          }
        }
        mu_end_window(*(mu_Context **)((long)_empty_width + 0x10));
      }
      mu_end(*(mu_Context **)((long)_empty_width + 0x10));
      handle_local._7_1_ = true;
    }
  }
  return handle_local._7_1_;
}

Assistant:

bool GUINewFrame(HGUI handle, std::vector<GUIComponent>& gui_components, std::vector<GUITexture> textures) {
    if (gui_components.empty() && textures.empty()) {
        return false;
    }

    uint32_t components_in_use = 0;
    for (const GUIComponent& component : gui_components) {
        if (component.IsInUse)
            ++components_in_use;
    }

    if (components_in_use == 0 && textures.empty()) {
        return false;
    }

    GUI* gui = (GUI*)handle;
    int window_w = 300;
    int empty_width[1] = {-1};

    mu_begin(gui->Ctx);
    if (mu_begin_window_ex(gui->Ctx, "", mu_rect(0, 0, window_w, gui->Height), MU_OPT_NOTITLE | MU_OPT_FORCE_RESIZE)) {
        if (!gui->Log.empty()) {
            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_begin_panel(gui->Ctx, "Log Output");
            mu_Container* panel = mu_get_current_container(gui->Ctx);

            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_text(gui->Ctx, gui->Log.c_str());
            mu_end_panel(gui->Ctx);
        } else {
            int label_text_w = 150;

            int column_1_w = (int)(window_w * 0.5f);
            int column_2_w = (int)(window_w * 0.5f) - 15;

            int component_1_w = window_w - label_text_w;
            int component_2_w = (component_1_w / 2.0f) - gui->Ctx->style->padding * 0.5f;
            int component_3_w = (component_1_w / 3.0f) - gui->Ctx->style->padding * 0.5f;
            int component_4_w = (component_1_w / 4.0f) - gui->Ctx->style->padding * 0.5f;
            int component_5_w = (component_1_w / 5.0f) - gui->Ctx->style->padding * 0.5f;

            for (GUIComponent& component : gui_components) {
                if (!component.IsInUse) {
                    continue;
                }

                int column_widths[2] = {column_1_w, column_2_w};
                mu_layout_row(gui->Ctx, 2, column_widths, 0);
                mu_layout_begin_column(gui->Ctx);
                switch (component.Type) {
                    case EGUIComponentTypeSlider1: {
                        mu_layout_row(gui->Ctx, 1, empty_width, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider2: {
                        int widths[2] = { component_2_w, -1 };
                        mu_layout_row(gui->Ctx, 2, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider3: {
                        int widths[3] = { component_3_w, component_3_w, -1 };
                        mu_layout_row(gui->Ctx, 3, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor3:
                    case EGUIComponentTypeSlider4: {
                        int widths[4] = { component_4_w, component_4_w, component_4_w, -1 };
                        mu_layout_row(gui->Ctx, 4, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor4: {
                        int widths[5] = { component_5_w, component_5_w, component_5_w, component_5_w, -1 };
                        mu_layout_row(gui->Ctx, 5, widths, 0);
                        break;
                    }
                }

                if (GUIIsSliderType(component.Type)) {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        mu_slider_ex(gui->Ctx, &component.Data[i], component.SliderRange.Start, component.SliderRange.End, 0.01f, "%.2f", MU_OPT_ALIGNCENTER);
                    }
                } else {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        component.Data[i] *= 255.0f;
                        mu_slider_ex(gui->Ctx, &component.Data[i], 0.0, 255.0f, 0, "%.0f", MU_OPT_ALIGNCENTER);
                        component.Data[i] /= 255.0f;
                    }
                    
                    mu_Color color;
                    color.r = (uint8_t)(component.Data[0] * 255.0f);
                    color.g = (uint8_t)(component.Data[1] * 255.0f);
                    color.b = (uint8_t)(component.Data[2] * 255.0f);
                    color.a = GUIComponents(component.Type) == 4 ? (uint8_t)(component.Data[3] * 255.0f) : 255;
                    mu_draw_rect(gui->Ctx, mu_layout_next(gui->Ctx), color);
                }
                mu_layout_end_column(gui->Ctx);

                mu_layout_begin_column(gui->Ctx);
                mu_layout_row(gui->Ctx, 1, empty_width, 0);
                mu_label(gui->Ctx, component.UniformName.c_str());
                mu_layout_end_column(gui->Ctx);
            }
        }
#if 0
        for (const auto& texture : textures) {
            float aspect = (float)texture.Width / (float)texture.Height;
            float max_width = ImGui::GetContentRegionAvailWidth();
            float height = max_width / aspect;

            ImGui::Image(texture.Id, ImVec2(max_width, height), ImVec2(0, 1), ImVec2(1, 0));
        }
#endif
        mu_end_window(gui->Ctx);
    }
    mu_end(gui->Ctx);

    return true;
}